

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::fuse_convolutiondepthwise_batchnorm(NetOptimize *this)

{
  size_type *this_00;
  float fVar1;
  int iVar2;
  Layer *pLVar3;
  int *piVar4;
  pointer ppLVar5;
  Layer *pLVar6;
  long lVar7;
  size_type sVar8;
  bool bVar9;
  uint uVar10;
  ulong uVar11;
  pointer piVar12;
  ulong uVar13;
  ulong uVar14;
  int j;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  float fVar19;
  float fVar20;
  undefined8 extraout_XMM1_Qa;
  undefined1 in_XMM1 [16];
  undefined1 auVar21 [16];
  undefined8 extraout_XMM1_Qb;
  ulong local_b8;
  vector<float,_std::allocator<float>_> b;
  vector<float,_std::allocator<float>_> a;
  Mat local_70;
  
  uVar17 = (ulong)((long)(this->super_Net).layers.
                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->super_Net).layers.
                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 3;
  iVar16 = (int)uVar17;
  uVar11 = 0;
  if (0 < iVar16) {
    uVar11 = uVar17 & 0xffffffff;
  }
  local_b8 = 1;
  uVar17 = 0;
  do {
    if (uVar17 == uVar11) {
      return 0;
    }
    bVar9 = std::operator!=(&(this->super_Net).layers.
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar17]->type,
                            "ConvolutionDepthWise");
    if (!bVar9) {
      iVar2 = *((this->super_Net).layers.
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar17]->tops).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      for (uVar18 = local_b8; (int)uVar18 < iVar16; uVar18 = uVar18 + 1) {
        bVar9 = std::operator!=(&(this->super_Net).layers.
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar18]->type,"BatchNorm")
        ;
        if (((!bVar9) &&
            (pLVar3 = (this->super_Net).layers.
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar18],
            piVar4 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
            (long)*(pointer *)
                   ((long)&(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl +
                   8) - (long)piVar4 == 4)) && (*piVar4 == iVar2)) {
          if ((int)uVar18 != iVar16) {
            ppLVar5 = (this->super_Net).layers.
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar3 = ppLVar5[uVar17];
            pLVar6 = ppLVar5[uVar18 & 0xffffffff];
            fprintf(_stderr,"fuse_convolutiondepthwise_batchnorm %s %s\n",
                    (pLVar3->name)._M_dataplus._M_p,(pLVar6->name)._M_dataplus._M_p);
            uVar10 = *(uint *)&pLVar6[1]._vptr_Layer;
            fVar1 = *(float *)((long)&pLVar6[1]._vptr_Layer + 4);
            std::vector<float,_std::allocator<float>_>::vector
                      (&a,(long)(int)uVar10,(allocator_type *)&local_70);
            std::vector<float,_std::allocator<float>_>::vector
                      (&b,(long)(int)uVar10,(allocator_type *)&local_70);
            uVar18 = 0;
            if (0 < (int)uVar10) {
              uVar18 = (ulong)uVar10;
            }
            for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
              fVar19 = *(float *)(*(long *)&pLVar6[2].one_blob_only + uVar13 * 4) + fVar1;
              auVar21 = rsqrtss(in_XMM1,ZEXT416((uint)fVar19));
              fVar20 = auVar21._0_4_;
              in_XMM1._4_12_ = auVar21._4_12_;
              fVar19 = fVar20 * -0.5 * (fVar19 * fVar20 * fVar20 + -3.0);
              lVar7 = *(long *)&pLVar6[1].one_blob_only;
              a.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar13] =
                   *(float *)(*(long *)((long)&pLVar6[2].name.field_2 + 8) + uVar13 * 4) -
                   *(float *)(*(long *)((long)&pLVar6[1].name.field_2 + 8) + uVar13 * 4) *
                   *(float *)(lVar7 + uVar13 * 4) * fVar19;
              in_XMM1._0_4_ = fVar19 * *(float *)(lVar7 + uVar13 * 4);
              b.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar13] = in_XMM1._0_4_;
            }
            if (*(int *)((long)&pLVar3[1].type.field_2 + 4) == 0) {
              *(undefined4 *)((long)&pLVar3[1].type.field_2 + 4) = 1;
              ncnn::Mat::Mat(&local_70,uVar10,4,(Allocator *)0x0);
              this_00 = &pLVar3[2].name._M_string_length;
              ncnn::Mat::operator=((Mat *)this_00,&local_70);
              ncnn::Mat::~Mat(&local_70);
              ncnn::Mat::fill((Mat *)this_00,0.0);
            }
            uVar10 = *(int *)((long)&pLVar3[1].type.field_2 + 8) / (int)uVar10;
            piVar12 = *(pointer *)
                       ((long)&pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl
                       + 0x10);
            sVar8 = pLVar3[2].name._M_string_length;
            uVar13 = 0;
            if (0 < (int)uVar10) {
              uVar13 = (ulong)uVar10;
            }
            for (uVar14 = 0; uVar14 != uVar18; uVar14 = uVar14 + 1) {
              for (uVar15 = 0; uVar13 != uVar15; uVar15 = uVar15 + 1) {
                piVar12[uVar15] =
                     (int)((float)piVar12[uVar15] *
                          b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar14]);
              }
              *(float *)(sVar8 + uVar14 * 4) =
                   *(float *)(sVar8 + uVar14 * 4) +
                   a.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar14];
              piVar12 = piVar12 + (int)uVar10;
            }
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      (&b.super__Vector_base<float,_std::allocator<float>_>);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      (&a.super__Vector_base<float,_std::allocator<float>_>);
            iVar2 = *(pLVar6->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            *(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = iVar2;
            (this->super_Net).blobs.super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar2].producer = (int)uVar17;
            std::__cxx11::string::assign((char *)&pLVar6->type);
            in_XMM1._8_8_ = extraout_XMM1_Qb;
            in_XMM1._0_8_ = extraout_XMM1_Qa;
          }
          break;
        }
      }
    }
    uVar17 = uVar17 + 1;
    local_b8 = local_b8 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_convolutiondepthwise_batchnorm()
{
    const int layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "ConvolutionDepthWise")
            continue;

        // ConvolutionDepthWise - BatchNorm
        int top_blob_index = layers[i]->tops[0];

        int j = i + 1;
        for (; j<layer_count; j++)
        {
            if (layers[j]->type != "BatchNorm")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse ConvolutionDepthWise - BatchNorm to ConvolutionDepthWise
        ncnn::ConvolutionDepthWise* convolutiondepthwise = (ncnn::ConvolutionDepthWise*)layers[i];
        ncnn::BatchNorm* batchnorm = (ncnn::BatchNorm*)layers[j];

        fprintf(stderr, "fuse_convolutiondepthwise_batchnorm %s %s\n", convolutiondepthwise->name.c_str(), batchnorm->name.c_str());

        {
            int channels = batchnorm->channels;
            float eps = batchnorm->eps;

            // a = bias - slope * mean / sqrt(var + eps)
            // b = slope / sqrt(var + eps)
            // value = value * b + a

            std::vector<float> a(channels);
            std::vector<float> b(channels);
            for (int i=0; i<channels; i++)
            {
                float sqrt_var = sqrt(batchnorm->var_data[i] + eps);
                a[i] = batchnorm->bias_data[i] - batchnorm->slope_data[i] * batchnorm->mean_data[i] / sqrt_var;
                b[i] = batchnorm->slope_data[i] / sqrt_var;
            }

            if (convolutiondepthwise->bias_term == 0)
            {
                // init bias as zero
                convolutiondepthwise->bias_term = 1;
                convolutiondepthwise->bias_data = ncnn::Mat(channels);
                convolutiondepthwise->bias_data.fill(0.f);
            }

            const int weight_per_outch = convolutiondepthwise->weight_data_size / channels;

            float* weight = convolutiondepthwise->weight_data;
            float* bias = convolutiondepthwise->bias_data;
            for (int i=0; i<channels; i++)
            {
                float* conv_weight_outch = weight + weight_per_outch * i;
                for (int j=0; j<weight_per_outch; j++)
                {
                    conv_weight_outch[j] *= b[i];
                }

                bias[i] += a[i];
            }
        }

        int top_blob_index_final = batchnorm->tops[0];
        convolutiondepthwise->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        batchnorm->type = "ncnnfused";
    }

    return 0;
}